

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

int __thiscall Board::countStonesFor(Board *this,Player *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = this->size;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  iVar2 = 0;
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (lVar5 = 0; (ulong)uVar1 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
      iVar2 = iVar2 + (uint)(*(Player **)
                              (*(long *)&(this->table).
                                         super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                         super__Vector_base<Cell,_std::allocator<Cell>_>._M_impl.
                                         super__Vector_impl_data + 0x10 + lVar5) == p);
    }
  }
  return iVar2;
}

Assistant:

int Board::countStonesFor(const Player *p){

    int count=0;
    for (int row=0; row<size; row++){
        for (int col=0; col<size; col++){
            if (getCell(row,col).belongsTo(p)){
                count++;
            }
        }
    }
    return count;
}